

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

QAction * __thiscall QMenuBarPrivate::getNextAction(QMenuBarPrivate *this,int _start,int increment)

{
  QAction *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QMenuBar *pQVar5;
  QStyle *pQVar6;
  qsizetype qVar7;
  const_reference ppQVar8;
  ulong uVar9;
  int in_EDX;
  int in_ESI;
  QMenuBarPrivate *in_RDI;
  QAction *current;
  int i;
  int end;
  int start;
  bool allowActiveAndDisabled;
  QMenuBar *q;
  QMenuBarPrivate *in_stack_00000088;
  QWidget *in_stack_ffffffffffffffa8;
  QRect *this_00;
  int local_48;
  int local_30;
  QAction *local_8;
  
  pQVar5 = q_func(in_RDI);
  updateGeometries(in_stack_00000088);
  pQVar6 = QWidget::style(in_stack_ffffffffffffffa8);
  iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xe,0,pQVar5);
  local_48 = in_ESI;
  if ((in_ESI == -1) && (in_EDX == -1)) {
    qVar7 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    local_48 = (int)qVar7;
  }
  local_30 = local_48;
  if (in_EDX == -1) {
    this_00 = (QRect *)0x0;
  }
  else {
    qVar7 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
    this_00 = (QRect *)(qVar7 + -1);
  }
  iVar4 = (int)this_00;
  while( true ) {
    do {
      if (local_30 == iVar4) {
        if (in_ESI == -1) {
          local_8 = (QAction *)0x0;
        }
        else {
          local_8 = getNextAction((QMenuBarPrivate *)CONCAT44(in_ESI,in_EDX),
                                  (int)((ulong)pQVar5 >> 0x20),(int)pQVar5);
        }
        return local_8;
      }
      local_30 = in_EDX + local_30;
      ppQVar8 = QList<QAction_*>::at
                          ((QList<QAction_*> *)this_00,(qsizetype)in_stack_ffffffffffffffa8);
      pQVar1 = *ppQVar8;
      QList<QRect>::at((QList<QRect> *)this_00,(qsizetype)in_stack_ffffffffffffffa8);
      bVar2 = QRect::isNull(this_00);
    } while (bVar2);
    if (iVar3 != 0) break;
    uVar9 = QAction::isEnabled();
    if ((uVar9 & 1) != 0) {
      return pQVar1;
    }
  }
  return pQVar1;
}

Assistant:

QAction *QMenuBarPrivate::getNextAction(const int _start, const int increment) const
{
    Q_Q(const QMenuBar);
    const_cast<QMenuBarPrivate*>(this)->updateGeometries();
    bool allowActiveAndDisabled = q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    const int start = (_start == -1 && increment == -1) ? actions.size() : _start;
    const int end =  increment == -1 ? 0 : actions.size() - 1;

    for (int i = start; i != end;) {
        i += increment;
        QAction *current = actions.at(i);
        if (!actionRects.at(i).isNull() && (allowActiveAndDisabled || current->isEnabled()))
            return current;
    }

    if (_start != -1) //let's try from the beginning or the end
        return getNextAction(-1, increment);

    return nullptr;
}